

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O3

void __thiscall crnlib::semaphore::try_release(semaphore *this,long releaseCount)

{
  ulong uVar1;
  
  if (0 < releaseCount) {
    uVar1 = releaseCount + 1;
    do {
      sem_post((sem_t *)this);
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
  }
  return;
}

Assistant:

void semaphore::try_release(long releaseCount)
    {
        CRNLIB_ASSERT(releaseCount >= 1);

#ifdef WIN32
        if (1 == releaseCount)
        {
            sem_post(&m_sem);
        }
        else
        {
            sem_post_multiple(&m_sem, releaseCount);
        }
#else
        while (releaseCount > 0)
        {
            sem_post(&m_sem);
            releaseCount--;
        }
#endif
    }